

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

void __thiscall
node::BlockManager::FindFilesToPrune
          (BlockManager *this,set<int,_std::less<int>,_std::allocator<int>_> *setFilesToPrune,
          int last_prune,Chainstate *chain,ChainstateManager *chainman)

{
  uint uVar1;
  long lVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer pCVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  pair<int,_int> pVar10;
  uint64_t uVar11;
  Logger *this_00;
  BlockfileCursor BVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  BlockfileCursor BVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  long local_a0;
  long local_90;
  ulong local_88;
  ulong local_80;
  ChainstateRole local_78;
  int count;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_70;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_owns = false;
  criticalblock2.super_unique_lock._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  uVar9 = (this->m_opts).prune_target;
  ChainstateManager::GetAll(&local_70,chainman);
  uVar9 = uVar9 / (ulong)((long)local_70.
                                super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_70.
                                super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3);
  uVar19 = 0x22600000;
  if (0x22600000 < uVar9) {
    uVar19 = uVar9;
  }
  if ((pair<int,_int>)
      local_70.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_70.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  iVar8 = (int)((ulong)((long)(chain->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(chain->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((0 < iVar8) && (((chainman->m_options).chainparams)->nPruneAfterHeight < (ulong)(iVar8 - 1)))
  {
    uVar1 = chainman->m_best_header->nHeight;
    pVar10 = ChainstateManager::GetPruneRange(chainman,chain,last_prune);
    local_70.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pVar10;
    uVar11 = CalculateCurrentUsage(this);
    count = 0;
    if (uVar19 <= uVar11 + 0x1100000) {
      ppCVar3 = (chain->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppCVar4 = (chain->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar6 = ChainstateManager::IsInitialBlockDownload(chainman);
      uVar14 = (int)((ulong)((long)ppCVar3 - (long)ppCVar4) >> 3) - 1;
      local_a0 = 0x1100000;
      if (bVar6 && uVar14 < uVar1) {
        local_a0 = ((long)(int)uVar1 - (long)(int)uVar14) * 1000000 + 0x1100000;
      }
      local_80 = local_80 & 0xffffffff00000000;
      bVar7 = (this->m_blockfile_cursors)._M_elems[0].
              super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
              super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
      BVar12 = (this->m_blockfile_cursors)._M_elems[0].
               super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
               super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
      iVar8 = BVar12.file_num;
      if ((bool)bVar7 == false) {
        iVar8 = 0;
      }
      bVar13 = (this->m_blockfile_cursors)._M_elems[1].
               super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
               super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
      BVar16 = (this->m_blockfile_cursors)._M_elems[1].
               super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
               super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
      iVar15 = BVar16.file_num;
      if ((bool)bVar13 == false) {
        iVar15 = 0;
      }
      if (iVar15 < iVar8) {
        iVar15 = iVar8;
      }
      if (0 < iVar15) {
        iVar8 = 0;
        iVar15 = 0;
        do {
          pCVar5 = (this->m_blockfile_info).
                   super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar1 = pCVar5[iVar15].nSize;
          if (uVar1 != 0) {
            if (local_a0 + uVar11 < uVar19) break;
            if ((pCVar5[iVar15].nHeightLast <= (uint)pVar10.second) &&
               ((uint)pVar10.first <= pCVar5[iVar15].nHeightFirst)) {
              uVar14 = pCVar5[iVar15].nUndoSize;
              PruneOneBlockFile(this,iVar15);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )setFilesToPrune,(int *)&local_80);
              uVar11 = uVar11 - (uVar1 + uVar14);
              count = iVar8 + 1;
              bVar7 = (this->m_blockfile_cursors)._M_elems[0].
                      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                      super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
              BVar12 = (this->m_blockfile_cursors)._M_elems[0].
                       super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                       super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
              bVar13 = (this->m_blockfile_cursors)._M_elems[1].
                       super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                       super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
              BVar16 = (this->m_blockfile_cursors)._M_elems[1].
                       super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                       super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
              iVar15 = (int)local_80;
              iVar8 = count;
            }
          }
          iVar15 = iVar15 + 1;
          local_80 = CONCAT44(local_80._4_4_,iVar15);
          iVar17 = 0;
          if ((bVar7 & 1) != 0) {
            iVar17 = BVar12.file_num;
          }
          iVar18 = BVar16.file_num;
          if ((bVar13 & 1) == 0) {
            iVar18 = 0;
          }
          if (iVar18 < iVar17) {
            iVar18 = iVar17;
          }
        } while (iVar15 < iVar18);
      }
    }
    this_00 = LogInstance();
    bVar6 = BCLog::Logger::WillLogCategoryLevel(this_00,PRUNE,Debug);
    if (bVar6) {
      local_78 = Chainstate::GetRole(chain);
      local_80 = uVar19 >> 0x14;
      lVar20 = uVar19 - uVar11;
      local_88 = uVar11 >> 0x14;
      local_90 = lVar20 + 0xfffff;
      if (-1 < lVar20) {
        local_90 = lVar20;
      }
      local_90 = local_90 >> 0x14;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x65;
      logging_function._M_str = "FindFilesToPrune";
      logging_function._M_len = 0x10;
      LogPrintFormatInternal<ChainstateRole,unsigned_long,unsigned_long,long,int,int,int>
                (logging_function,source_file,0x175,PRUNE,Debug,(ConstevalFormatString<7U>)0xf7e24d,
                 &local_78,&local_80,&local_88,&local_90,(int *)&local_70,
                 (int *)((long)&local_70.
                                super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4),&count);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockManager::FindFilesToPrune(
    std::set<int>& setFilesToPrune,
    int last_prune,
    const Chainstate& chain,
    ChainstateManager& chainman)
{
    LOCK2(cs_main, cs_LastBlockFile);
    // Distribute our -prune budget over all chainstates.
    const auto target = std::max(
        MIN_DISK_SPACE_FOR_BLOCK_FILES, GetPruneTarget() / chainman.GetAll().size());
    const uint64_t target_sync_height = chainman.m_best_header->nHeight;

    if (chain.m_chain.Height() < 0 || target == 0) {
        return;
    }
    if (static_cast<uint64_t>(chain.m_chain.Height()) <= chainman.GetParams().PruneAfterHeight()) {
        return;
    }

    const auto [min_block_to_prune, last_block_can_prune] = chainman.GetPruneRange(chain, last_prune);

    uint64_t nCurrentUsage = CalculateCurrentUsage();
    // We don't check to prune until after we've allocated new space for files
    // So we should leave a buffer under our target to account for another allocation
    // before the next pruning.
    uint64_t nBuffer = BLOCKFILE_CHUNK_SIZE + UNDOFILE_CHUNK_SIZE;
    uint64_t nBytesToPrune;
    int count = 0;

    if (nCurrentUsage + nBuffer >= target) {
        // On a prune event, the chainstate DB is flushed.
        // To avoid excessive prune events negating the benefit of high dbcache
        // values, we should not prune too rapidly.
        // So when pruning in IBD, increase the buffer to avoid a re-prune too soon.
        const auto chain_tip_height = chain.m_chain.Height();
        if (chainman.IsInitialBlockDownload() && target_sync_height > (uint64_t)chain_tip_height) {
            // Since this is only relevant during IBD, we assume blocks are at least 1 MB on average
            static constexpr uint64_t average_block_size = 1000000;  /* 1 MB */
            const uint64_t remaining_blocks = target_sync_height - chain_tip_height;
            nBuffer += average_block_size * remaining_blocks;
        }

        for (int fileNumber = 0; fileNumber < this->MaxBlockfileNum(); fileNumber++) {
            const auto& fileinfo = m_blockfile_info[fileNumber];
            nBytesToPrune = fileinfo.nSize + fileinfo.nUndoSize;

            if (fileinfo.nSize == 0) {
                continue;
            }

            if (nCurrentUsage + nBuffer < target) { // are we below our target?
                break;
            }

            // don't prune files that could have a block that's not within the allowable
            // prune range for the chain being pruned.
            if (fileinfo.nHeightLast > (unsigned)last_block_can_prune || fileinfo.nHeightFirst < (unsigned)min_block_to_prune) {
                continue;
            }

            PruneOneBlockFile(fileNumber);
            // Queue up the files for removal
            setFilesToPrune.insert(fileNumber);
            nCurrentUsage -= nBytesToPrune;
            count++;
        }
    }

    LogDebug(BCLog::PRUNE, "[%s] target=%dMiB actual=%dMiB diff=%dMiB min_height=%d max_prune_height=%d removed %d blk/rev pairs\n",
             chain.GetRole(), target / 1024 / 1024, nCurrentUsage / 1024 / 1024,
             (int64_t(target) - int64_t(nCurrentUsage)) / 1024 / 1024,
             min_block_to_prune, last_block_can_prune, count);
}